

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::copy_impliedBoundsToModelBounds(HModel *this)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  
  std::vector<double,_std::allocator<double>_>::resize(&this->SvColLower,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->SvColUpper,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->SvRowLower,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->SvRowUpper,(long)this->numRow);
  iVar1 = this->numCol;
  if (0 < (long)iVar1) {
    pdVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->SvColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->SvColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pdVar4[lVar6] = pdVar2[lVar6];
      pdVar5[lVar6] = pdVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  iVar1 = this->numRow;
  if (0 < (long)iVar1) {
    pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->SvRowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->SvRowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pdVar4[lVar6] = pdVar2[lVar6];
      pdVar5[lVar6] = pdVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  this->mlFg_haveSavedBounds = 1;
  this->usingImpliedBoundsPresolve = true;
  util_chgColBoundsAll
            (this,(this->primalColLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start,
             (this->primalColUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start);
  util_chgRowBoundsAll
            (this,(this->primalRowLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start,
             (this->primalRowUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void HModel::copy_impliedBoundsToModelBounds() {
  //Save copies of the current model bounds
  SvColLower.resize(numCol);
  SvColUpper.resize(numCol);
  SvRowLower.resize(numRow);
  SvRowUpper.resize(numRow);
  for (int i = 0; i < numCol; i++) {
    SvColLower[i] = colLower[i];
    SvColUpper[i] = colUpper[i];
  }
  for (int i = 0; i < numRow; i++) {
    SvRowLower[i] = rowLower[i];
    SvRowUpper[i] = rowUpper[i];
  }
  // Indicate that there are saved bounds - which must be scaled if the model is scaled
  mlFg_haveSavedBounds = 1;
  // Change to implied bounds
  usingImpliedBoundsPresolve = true;
  util_chgColBoundsAll(&primalColLowerImplied[0], &primalColUpperImplied[0]);
  util_chgRowBoundsAll(&primalRowLowerImplied[0], &primalRowUpperImplied[0]);
}